

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDFObjectHandle::wrapInArray(QPDFObjectHandle *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  QPDFObjectHandle *in_RSI;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle *this_local;
  QPDFObjectHandle *result;
  
  bVar1 = isArray(in_RSI);
  if (bVar1) {
    QPDFObjectHandle(this,in_RSI);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    newArray();
    appendItem(this,in_RSI);
    _Var2._M_pi = extraout_RDX_00;
  }
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::wrapInArray()
{
    if (isArray()) {
        return *this;
    }
    QPDFObjectHandle result = QPDFObjectHandle::newArray();
    result.appendItem(*this);
    return result;
}